

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint8_t *buf;
  nn_chunkref *in_RSI;
  nn_surveyor *in_RDI;
  uint32_t surveyid;
  nn_surveyor *surveyor;
  int rc;
  int in_stack_ffffffffffffffbc;
  nn_chunkref *in_stack_ffffffffffffffc0;
  FILE *__stream;
  nn_surveyor *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  local_38 = in_RDI;
  if (in_RDI == (nn_surveyor *)0x0) {
    local_38 = (nn_surveyor *)0x0;
  }
  iVar1 = nn_surveyor_inprogress(local_38);
  if (iVar1 == 0) {
    if (local_38->timedout == 1) {
      local_38->timedout = 0;
      local_4 = -0x6e;
    }
    else {
      local_4 = -0x9523dfe;
    }
  }
  else {
    do {
      do {
        iVar1 = nn_xsurveyor_recv((nn_sockbase *)local_38,
                                  (nn_msg *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 == -0xb) {
          return -0xb;
        }
        if (iVar1 != 0) {
          nn_backtrace_print();
          __stream = _stderr;
          pcVar2 = nn_err_strerror(in_stack_ffffffffffffffbc);
          fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
                  ,0x100);
          fflush(_stderr);
          nn_err_abort();
        }
        sVar3 = nn_chunkref_size(in_stack_ffffffffffffffc0);
      } while (sVar3 != 4);
      buf = (uint8_t *)nn_chunkref_data(in_RSI);
      in_stack_ffffffffffffffd4 = nn_getl(buf);
    } while (in_stack_ffffffffffffffd4 != local_38->surveyid);
    nn_chunkref_term(in_stack_ffffffffffffffc0);
    nn_chunkref_init((nn_chunkref *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(size_t)local_38);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nn_surveyor_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_surveyor *surveyor;
    uint32_t surveyid;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  If no survey is going on return EFSM error. */
    if (nn_slow (!nn_surveyor_inprogress (surveyor))) {
        if (surveyor->timedout == NN_SURVEYOR_TIMEDOUT) {
            surveyor->timedout = 0;
            return -ETIMEDOUT;
        } else
            return -EFSM;
    }

    while (1) {

        /*  Get next response. */
        rc = nn_xsurveyor_recv (&surveyor->xsurveyor.sockbase, msg);
        if (nn_slow (rc == -EAGAIN))
            return -EAGAIN;
        errnum_assert (rc == 0, -rc);

        /*  Get the survey ID. Ignore any stale responses. */
        /*  TODO: This should be done asynchronously! */
        if (nn_slow (nn_chunkref_size (&msg->sphdr) != sizeof (uint32_t)))
            continue;
        surveyid = nn_getl (nn_chunkref_data (&msg->sphdr));
        if (nn_slow (surveyid != surveyor->surveyid))
            continue;

        /*  Discard the header and return the message to the user. */
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, 0);
        break;
    }

    return 0;
}